

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::MonitorTask::checkArguments
          (MonitorTask *this,ASTContext *context,Args *args,SourceRange range,Expression *iterOrThis
          )

{
  SourceRange SVar1;
  bool bVar2;
  Type *pTVar3;
  iterator iVar4;
  reference ppEVar5;
  SourceLocation in_RCX;
  ASTContext *in_RSI;
  SourceLocation in_R8;
  Expression *arg;
  iterator __end3;
  iterator __begin3;
  Args *__range3;
  MonitorVisitor visitor;
  Type *result;
  Expression *in_stack_ffffffffffffff88;
  Expression *in_stack_ffffffffffffff90;
  __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  in_stack_ffffffffffffff98;
  ASTContext *in_stack_ffffffffffffffa0;
  MonitorVisitor in_stack_ffffffffffffffa8;
  
  SVar1.endLoc = in_R8;
  SVar1.startLoc = in_RCX;
  pTVar3 = builtins::DisplayTask::checkArguments
                     ((DisplayTask *)in_stack_ffffffffffffffa8.context,in_stack_ffffffffffffffa0,
                      (Args *)in_stack_ffffffffffffff98._M_current,SVar1,in_stack_ffffffffffffff90);
  bVar2 = Type::isError((Type *)0x98d818);
  if (!bVar2) {
    MonitorVisitor::MonitorVisitor((MonitorVisitor *)&stack0xffffffffffffffa8,in_RSI);
    iVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::begin
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                       in_stack_ffffffffffffff88);
    iVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                      (iVar4._M_current);
    while (bVar2 = __gnu_cxx::
                   operator==<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)iVar4._M_current,
                              (__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                               *)in_stack_ffffffffffffff88), ((bVar2 ^ 0xffU) & 1) != 0) {
      ppEVar5 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                ::operator*((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                             *)&stack0xffffffffffffff98);
      in_stack_ffffffffffffff88 = *ppEVar5;
      Expression::visit<slang::ast::builtins::MonitorVisitor&>
                ((Expression *)iVar4._M_current,(MonitorVisitor *)in_stack_ffffffffffffff88);
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
      ::operator++((__normal_iterator<const_slang::ast::Expression_*const_*,_std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
                    *)&stack0xffffffffffffff98);
    }
  }
  return pTVar3;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterOrThis) const final {
        auto& result = DisplayTask::checkArguments(context, args, range, iterOrThis);
        if (result.isError())
            return result;

        // Additional restriction for monitor tasks: automatic variables cannot be referenced.
        MonitorVisitor visitor(context);
        for (auto arg : args)
            arg->visit(visitor);

        return result;
    }